

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Crop_x86_avx::forward(Crop_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t in_RCX;
  size_t in_RDX;
  long in_RSI;
  undefined1 *__arg;
  int **__arg_00;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat borderm_3;
  Mat m_3;
  int z_1;
  int q_3;
  Mat bottom_blob_sliced_3;
  size_t out_elemsize_7;
  int out_elempack_7;
  Mat borderm_2;
  Mat m_2;
  int q_2;
  Mat bottom_blob_sliced_2;
  size_t out_elemsize_6;
  int out_elempack_6;
  size_t out_elemsize_5;
  int out_elempack_5;
  size_t out_elemsize_4;
  int out_elempack_4;
  int _outc_1;
  int _outd_1;
  int _outh_1;
  int _outw_1;
  int _coffset_1;
  int _doffset_1;
  int _hoffset_1;
  int _woffset_1;
  Mat borderm_1;
  Mat m_1;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  size_t out_elemsize_3;
  int out_elempack_3;
  Mat borderm;
  Mat m;
  int q;
  Mat bottom_blob_sliced;
  size_t out_elemsize_2;
  int out_elempack_2;
  size_t out_elemsize_1;
  int out_elempack_1;
  size_t out_elemsize;
  int out_elempack;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *in_stack_fffffffffffff758;
  Mat *in_stack_fffffffffffff760;
  Mat *pMVar5;
  Mat *pMVar6;
  int *piVar7;
  int in_stack_fffffffffffff778;
  int in_stack_fffffffffffff77c;
  int in_stack_fffffffffffff780;
  int in_stack_fffffffffffff784;
  undefined4 in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  int in_stack_fffffffffffff790;
  int in_stack_fffffffffffff794;
  undefined4 in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff79c;
  undefined4 in_stack_fffffffffffff7a0;
  int in_stack_fffffffffffff7a4;
  int local_858;
  int local_854;
  undefined8 in_stack_fffffffffffff7b0;
  Mat *in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7c0;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff7c4;
  int local_830;
  int local_81c;
  int local_818;
  int local_814;
  int *in_stack_fffffffffffff838;
  int *in_stack_fffffffffffff840;
  int *in_stack_fffffffffffff848;
  int *in_stack_fffffffffffff850;
  Mat *in_stack_fffffffffffff858;
  Crop *in_stack_fffffffffffff860;
  int *in_stack_fffffffffffff870;
  int *in_stack_fffffffffffff878;
  int *in_stack_fffffffffffff880;
  int *in_stack_fffffffffffff888;
  int local_648;
  int local_644;
  Mat local_640;
  undefined1 local_5f8 [72];
  long local_5b0;
  int local_5a4;
  int local_50c;
  Option *in_stack_fffffffffffffb00;
  Mat *in_stack_fffffffffffffb08;
  Mat *in_stack_fffffffffffffb10;
  Crop *in_stack_fffffffffffffb18;
  undefined1 local_4c0 [72];
  long local_478;
  int local_46c;
  long local_468;
  int local_45c;
  long local_458;
  int local_44c;
  int local_400;
  undefined1 local_3fc [8];
  Mat local_3f4 [4];
  int local_2c0;
  int local_2bc;
  Mat local_2b8;
  undefined1 local_270 [72];
  long local_228;
  int local_21c;
  int local_188;
  undefined4 local_184;
  Mat local_180;
  undefined1 local_138 [72];
  long local_f0;
  int local_e4;
  long local_e0;
  int local_d4;
  long local_d0;
  int local_c8;
  int local_6c;
  undefined1 local_68 [8];
  undefined1 local_60 [36];
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  size_t local_28;
  size_t local_20;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_38 = *(int *)(in_RSI + 0x38);
  local_3c = *(int *)(in_RSI + 0x28);
  local_60._24_8_ = *(ulong *)(in_RSI + 0x10);
  local_60._20_4_ = *(int *)(in_RSI + 0x18);
  local_28 = in_RCX;
  local_20 = in_RDX;
  if (local_60._20_4_ == 8) {
    ncnn::Mat::shape((Mat *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
    piVar7 = &local_6c;
    pMVar6 = (Mat *)local_68;
    in_stack_fffffffffffff760 = (Mat *)(local_68 + 4);
    in_stack_fffffffffffff758 = (Mat *)local_60;
    __arg = local_60 + 8;
    Crop::resolve_crop_roi
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848,in_stack_fffffffffffff840,in_stack_fffffffffffff838,
               in_stack_fffffffffffff870,in_stack_fffffffffffff878,in_stack_fffffffffffff880,
               in_stack_fffffffffffff888);
    ncnn::Mat::~Mat((Mat *)0x372b72);
    iVar2 = (int)((ulong)pMVar6 >> 0x20);
    if (local_3c == 1) {
      if ((int)local_60._0_4_ % 8 == 0) {
        local_814 = 8;
      }
      else {
        local_814 = 1;
        if ((int)local_60._0_4_ % 4 == 0) {
          local_814 = 4;
        }
      }
      local_c8 = local_814;
      local_d0 = ((ulong)local_60._24_8_ / (ulong)(long)(int)local_60._20_4_) * (long)local_814;
      if (((int)local_60._0_4_ / local_814 == local_2c) && (local_814 == 8)) {
        ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
        return 0;
      }
      if (((int)local_60._16_4_ % 8 == 0) && (local_814 == 8)) {
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                          in_stack_fffffffffffff77c,(size_t)piVar7,iVar2,
                          (Allocator *)in_stack_fffffffffffff760);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff760);
        if (!bVar1) {
          crop_pack8_avx((Mat *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                         in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
                         (int)in_stack_fffffffffffff7b0);
          return 0;
        }
        return -100;
      }
    }
    if (local_3c == 2) {
      if ((int)local_68._4_4_ % 8 == 0) {
        local_818 = 8;
      }
      else {
        local_818 = 1;
        if ((int)local_68._4_4_ % 4 == 0) {
          local_818 = 4;
        }
      }
      local_d4 = local_818;
      local_e0 = ((ulong)local_60._24_8_ / (ulong)(long)(int)local_60._20_4_) * (long)local_818;
      if (((local_60._0_4_ == local_2c) && ((int)local_68._4_4_ / local_818 == local_30)) &&
         (local_818 == 8)) {
        ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
        return 0;
      }
      if (((int)local_60._12_4_ % 8 == 0) && (local_818 == 8)) {
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                          in_stack_fffffffffffff77c,in_stack_fffffffffffff778,(size_t)piVar7,iVar2,
                          (Allocator *)in_stack_fffffffffffff760);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff760);
        if (!bVar1) {
          crop_pack8_avx((Mat *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                         in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
                         (int)in_stack_fffffffffffff7b0);
          return 0;
        }
        return -100;
      }
    }
    if (local_3c == 3) {
      if (local_6c % 8 == 0) {
        local_81c = 8;
      }
      else {
        local_81c = 1;
        if (local_6c % 4 == 0) {
          local_81c = 4;
        }
      }
      local_e4 = local_81c;
      local_f0 = ((ulong)local_60._24_8_ / (ulong)(long)(int)local_60._20_4_) * (long)local_81c;
      if (((local_60._0_4_ == local_2c) && (local_68._4_4_ == local_30)) &&
         ((local_6c / local_81c == local_38 && (local_81c == 8)))) {
        ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
        return 0;
      }
      if (((int)local_60._4_4_ % 8 == 0) && (local_81c == 8)) {
        iVar2 = local_6c / 8;
        ncnn::Mat::channel_range
                  ((Mat *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                   in_stack_fffffffffffff784,in_stack_fffffffffffff780);
        iVar3 = (int)((ulong)piVar7 >> 0x20);
        if ((local_60._0_4_ == local_2c) && (local_68._4_4_ == local_30)) {
          ncnn::Mat::clone(&local_180,(__fn *)local_138,(void *)0x0,iVar2,__arg);
          ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
          ncnn::Mat::~Mat((Mat *)0x373099);
          bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff760);
          if (bVar1) {
            local_4 = -100;
            goto LAB_003732ba;
          }
        }
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                          in_stack_fffffffffffff77c,in_stack_fffffffffffff778,iVar3,(size_t)pMVar6,
                          (int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                          (Allocator *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790)
                         );
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff760);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          for (local_188 = 0; local_188 < *(int *)(local_20 + 0x38); local_188 = local_188 + 1) {
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                               in_stack_fffffffffffff784);
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                               in_stack_fffffffffffff784);
            crop_pack8_avx((Mat *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                           in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20)
                           ,(int)in_stack_fffffffffffff7b0);
            ncnn::Mat::~Mat((Mat *)0x37323b);
            ncnn::Mat::~Mat((Mat *)0x373248);
          }
          local_4 = 0;
        }
LAB_003732ba:
        local_184 = 1;
        ncnn::Mat::~Mat((Mat *)0x3732c7);
        return local_4;
      }
    }
    if (local_3c == 4) {
      if (local_6c % 8 == 0) {
        local_830 = 8;
      }
      else {
        local_830 = 1;
        if (local_6c % 4 == 0) {
          local_830 = 4;
        }
      }
      local_21c = local_830;
      local_228 = ((ulong)local_60._24_8_ / (ulong)(long)(int)local_60._20_4_) * (long)local_830;
      if ((((local_60._0_4_ == local_2c) && (local_68._4_4_ == local_30)) &&
          (local_68._0_4_ == local_34)) && ((local_6c / local_830 == local_38 && (local_830 == 8))))
      {
        ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
        return 0;
      }
      if (((int)local_60._4_4_ % 8 == 0) && (local_830 == 8)) {
        iVar2 = local_6c / 8;
        ncnn::Mat::channel_range
                  ((Mat *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                   in_stack_fffffffffffff784,in_stack_fffffffffffff780);
        if (((local_60._0_4_ == local_2c) && (local_68._4_4_ == local_30)) &&
           (local_68._0_4_ == local_34)) {
          ncnn::Mat::clone(&local_2b8,(__fn *)local_270,(void *)0x0,iVar2,__arg);
          ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
          ncnn::Mat::~Mat((Mat *)0x3734b9);
          bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff760);
          if (bVar1) {
            local_4 = -100;
            goto LAB_003737b9;
          }
        }
        pMVar5 = *(Mat **)(local_28 + 8);
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                          in_stack_fffffffffffff77c,in_stack_fffffffffffff778,
                          (int)((ulong)piVar7 >> 0x20),(int)piVar7,(size_t)pMVar6,
                          in_stack_fffffffffffff790,
                          (Allocator *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798)
                         );
        bVar1 = ncnn::Mat::empty(pMVar5);
        uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7c0);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          iVar2 = local_68._4_4_;
          for (local_2bc = 0; local_2bc < *(int *)(local_20 + 0x38); local_2bc = local_2bc + 1) {
            for (local_2c0 = 0; local_2c0 < (int)local_68._0_4_; local_2c0 = local_2c0 + 1) {
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788
                                                ),in_stack_fffffffffffff784);
              ncnn::Mat::depth(pMVar6,(int)((ulong)pMVar5 >> 0x20));
              ncnn::Mat::~Mat((Mat *)0x37365e);
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788
                                                ),in_stack_fffffffffffff784);
              ncnn::Mat::depth(pMVar6,(int)((ulong)pMVar5 >> 0x20));
              ncnn::Mat::~Mat((Mat *)0x3736a7);
              crop_pack8_avx((Mat *)CONCAT44(iVar2,uVar8),in_stack_fffffffffffff7b8,
                             (int)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
                             (int)in_stack_fffffffffffff7b0);
              ncnn::Mat::~Mat((Mat *)0x3736d9);
              ncnn::Mat::~Mat((Mat *)0x3736e6);
            }
          }
          local_4 = 0;
        }
LAB_003737b9:
        local_184 = 1;
        ncnn::Mat::~Mat((Mat *)0x3737c6);
        return local_4;
      }
    }
  }
  if (local_60._20_4_ != 4) {
LAB_003744d2:
    ncnn::Mat::Mat(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    if (local_60._20_4_ != 1) {
      convert_packing((Mat *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                      (Mat *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                      in_stack_fffffffffffff794,
                      (Option *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
    }
    local_4 = Crop::forward(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                            in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
    local_184 = 1;
    ncnn::Mat::~Mat((Mat *)0x3745d0);
    return local_4;
  }
  ncnn::Mat::shape((Mat *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  piVar7 = &local_400;
  pMVar6 = (Mat *)local_3fc;
  in_stack_fffffffffffff760 = (Mat *)(local_3fc + 4);
  in_stack_fffffffffffff758 = local_3f4;
  __arg_00 = &local_3f4[0].refcount;
  Crop::resolve_crop_roi
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848,in_stack_fffffffffffff840,in_stack_fffffffffffff838,
             in_stack_fffffffffffff870,in_stack_fffffffffffff878,in_stack_fffffffffffff880,
             in_stack_fffffffffffff888);
  ncnn::Mat::~Mat((Mat *)0x373890);
  iVar2 = (int)((ulong)pMVar6 >> 0x20);
  if (local_3c == 1) {
    if ((int)local_3f4[0].data % 8 == 0) {
      local_854 = 8;
    }
    else {
      local_854 = 1;
      if ((int)local_3f4[0].data % 4 == 0) {
        local_854 = 4;
      }
    }
    local_44c = local_854;
    local_458 = ((ulong)local_60._24_8_ / (ulong)(long)(int)local_60._20_4_) * (long)local_854;
    if (((int)local_3f4[0].data / local_854 == local_2c) && (local_854 == 4)) {
      ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
      return 0;
    }
    if (((int)local_3f4[0].elemsize % 4 == 0) && (local_854 == 4)) {
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                        in_stack_fffffffffffff77c,(size_t)piVar7,iVar2,
                        (Allocator *)in_stack_fffffffffffff760);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff760);
      if (!bVar1) {
        crop_pack4_sse((Mat *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                       (Mat *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                       in_stack_fffffffffffff794,in_stack_fffffffffffff790);
        return 0;
      }
      return -100;
    }
  }
  if (local_3c == 2) {
    if ((int)local_3fc._4_4_ % 8 == 0) {
      local_858 = 8;
    }
    else {
      local_858 = 1;
      if ((int)local_3fc._4_4_ % 4 == 0) {
        local_858 = 4;
      }
    }
    local_45c = local_858;
    local_468 = ((ulong)local_60._24_8_ / (ulong)(long)(int)local_60._20_4_) * (long)local_858;
    if ((((int)local_3f4[0].data == local_2c) && ((int)local_3fc._4_4_ / local_858 == local_30)) &&
       (local_858 == 4)) {
      ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
      return 0;
    }
    if ((local_3f4[0].refcount._4_4_ % 4 == 0) && (local_858 == 4)) {
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                        in_stack_fffffffffffff77c,in_stack_fffffffffffff778,(size_t)piVar7,iVar2,
                        (Allocator *)in_stack_fffffffffffff760);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff760);
      if (!bVar1) {
        crop_pack4_sse((Mat *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                       (Mat *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                       in_stack_fffffffffffff794,in_stack_fffffffffffff790);
        return 0;
      }
      return -100;
    }
  }
  if (local_3c == 3) {
    if (local_400 % 8 == 0) {
      in_stack_fffffffffffff7a4 = 8;
    }
    else {
      in_stack_fffffffffffff7a4 = 1;
      if (local_400 % 4 == 0) {
        in_stack_fffffffffffff7a4 = 4;
      }
    }
    local_478 = ((ulong)local_60._24_8_ / (ulong)(long)(int)local_60._20_4_) *
                (long)in_stack_fffffffffffff7a4;
    local_46c = in_stack_fffffffffffff7a4;
    if ((((int)local_3f4[0].data == local_2c) && (local_3fc._4_4_ == local_30)) &&
       ((local_400 / in_stack_fffffffffffff7a4 == local_38 && (in_stack_fffffffffffff7a4 == 4)))) {
      ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
      return 0;
    }
    if ((local_3f4[0].data._4_4_ % 4 == 0) && (in_stack_fffffffffffff7a4 == 4)) {
      iVar2 = local_3f4[0].data._4_4_ / 4;
      iVar3 = local_400 / 4;
      ncnn::Mat::channel_range
                ((Mat *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                 in_stack_fffffffffffff784,in_stack_fffffffffffff780);
      iVar4 = (int)((ulong)piVar7 >> 0x20);
      if (((int)local_3f4[0].data == local_2c) && (local_3fc._4_4_ == local_30)) {
        ncnn::Mat::clone((Mat *)&stack0xfffffffffffffaf8,(__fn *)local_4c0,(void *)0x0,iVar3,
                         __arg_00);
        ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
        ncnn::Mat::~Mat((Mat *)0x373d96);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff760);
        in_stack_fffffffffffff79c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff79c);
        if (bVar1) {
          local_4 = -100;
          goto LAB_00373fab;
        }
      }
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                        in_stack_fffffffffffff77c,in_stack_fffffffffffff778,iVar4,(size_t)pMVar6,
                        (int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                        (Allocator *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff760);
      iVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff794);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        iVar4 = local_3fc._4_4_;
        for (local_50c = 0; local_50c < *(int *)(local_20 + 0x38); local_50c = local_50c + 1) {
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                             in_stack_fffffffffffff784);
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                             in_stack_fffffffffffff784);
          crop_pack4_sse((Mat *)CONCAT44(in_stack_fffffffffffff7a4,iVar2),
                         (Mat *)CONCAT44(in_stack_fffffffffffff79c,iVar4),iVar3,
                         in_stack_fffffffffffff790);
          ncnn::Mat::~Mat((Mat *)0x373f2c);
          ncnn::Mat::~Mat((Mat *)0x373f39);
        }
        local_4 = 0;
      }
LAB_00373fab:
      local_184 = 1;
      ncnn::Mat::~Mat((Mat *)0x373fb8);
      return local_4;
    }
  }
  if (local_3c != 4) goto LAB_003744d2;
  if (local_400 % 8 == 0) {
    iVar2 = 8;
  }
  else {
    iVar2 = 1;
    if (local_400 % 4 == 0) {
      iVar2 = 4;
    }
  }
  local_5b0 = ((ulong)local_60._24_8_ / (ulong)(long)(int)local_60._20_4_) * (long)iVar2;
  local_5a4 = iVar2;
  if (((((int)local_3f4[0].data == local_2c) && (local_3fc._4_4_ == local_30)) &&
      (local_3fc._0_4_ == local_34)) && ((local_400 / iVar2 == local_38 && (iVar2 == 4)))) {
    ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
    return 0;
  }
  if ((local_3f4[0].data._4_4_ % 4 != 0) || (iVar2 != 4)) goto LAB_003744d2;
  iVar3 = local_3f4[0].data._4_4_ / 4;
  iVar4 = local_400 / 4;
  ncnn::Mat::channel_range
            ((Mat *)CONCAT44(iVar3,in_stack_fffffffffffff788),in_stack_fffffffffffff784,
             in_stack_fffffffffffff780);
  if ((((int)local_3f4[0].data == local_2c) && (local_3fc._4_4_ == local_30)) &&
     (local_3fc._0_4_ == local_34)) {
    ncnn::Mat::clone(&local_640,(__fn *)local_5f8,(void *)0x0,iVar4,__arg_00);
    ncnn::Mat::operator=(pMVar6,in_stack_fffffffffffff760);
    ncnn::Mat::~Mat((Mat *)0x3741aa);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff760);
    in_stack_fffffffffffff788 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff788);
    if (bVar1) {
      local_4 = -100;
      goto LAB_003744aa;
    }
  }
  pMVar5 = *(Mat **)(local_28 + 8);
  ncnn::Mat::create((Mat *)CONCAT44(local_3fc._4_4_,in_stack_fffffffffffff780),
                    in_stack_fffffffffffff77c,in_stack_fffffffffffff778,(int)((ulong)piVar7 >> 0x20)
                    ,(int)piVar7,(size_t)pMVar6,iVar2,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  bVar1 = ncnn::Mat::empty(pMVar5);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    iVar4 = local_3fc._4_4_;
    for (local_644 = 0; local_644 < *(int *)(local_20 + 0x38); local_644 = local_644 + 1) {
      for (local_648 = 0; local_648 < (int)local_3fc._0_4_; local_648 = local_648 + 1) {
        ncnn::Mat::channel((Mat *)CONCAT44(iVar3,in_stack_fffffffffffff788),iVar4);
        ncnn::Mat::depth(pMVar6,(int)((ulong)pMVar5 >> 0x20));
        ncnn::Mat::~Mat((Mat *)0x37434f);
        ncnn::Mat::channel((Mat *)CONCAT44(iVar3,in_stack_fffffffffffff788),iVar4);
        ncnn::Mat::depth(pMVar6,(int)((ulong)pMVar5 >> 0x20));
        ncnn::Mat::~Mat((Mat *)0x374398);
        crop_pack4_sse((Mat *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                       (Mat *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                       in_stack_fffffffffffff794,iVar2);
        ncnn::Mat::~Mat((Mat *)0x3743ca);
        ncnn::Mat::~Mat((Mat *)0x3743d7);
      }
    }
    local_4 = 0;
  }
LAB_003744aa:
  local_184 = 1;
  ncnn::Mat::~Mat((Mat *)0x3744b7);
  return local_4;
}

Assistant:

int Crop_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}